

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::GetIDWithSeed(char *str,char *str_end,ImGuiID seed)

{
  ImGuiID id_00;
  size_t local_38;
  ImGuiContext_conflict *g;
  ImGuiID id;
  ImGuiID seed_local;
  char *str_end_local;
  char *str_local;
  
  if (str_end == (char *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = (long)str_end - (long)str;
  }
  id_00 = ImHashStr(str,local_38,seed);
  KeepAliveID(id_00);
  if (GImGui->DebugHookIdInfo == id_00) {
    DebugHookIdInfo(id_00,0xb,str,str_end);
  }
  return id_00;
}

Assistant:

ImGuiID ImGui::GetIDWithSeed(const char* str, const char* str_end, ImGuiID seed)
{
    ImGuiID id = ImHashStr(str, str_end ? (str_end - str) : 0, seed);
    KeepAliveID(id);
    ImGuiContext& g = *GImGui;
    if (g.DebugHookIdInfo == id)
        DebugHookIdInfo(id, ImGuiDataType_String, str, str_end);
    return id;
}